

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int push_psbt_input(uchar **cursor,size_t *max,uint32_t flags,wally_psbt_input *input)

{
  int iVar1;
  size_t local_4c0;
  size_t wit_len;
  size_t wit_max;
  uchar *w;
  uchar wit_bytes [50];
  uchar *local_468;
  uchar *ptr;
  uchar *buff_p;
  uchar buff [1024];
  size_t local_50;
  size_t remaining;
  size_t buff_len;
  wally_tx_output *utxo;
  wally_psbt_input *pwStack_30;
  int ret;
  wally_psbt_input *input_local;
  size_t *psStack_20;
  uint32_t flags_local;
  size_t *max_local;
  uchar **cursor_local;
  
  pwStack_30 = input;
  input_local._4_4_ = flags;
  psStack_20 = max;
  max_local = (size_t *)cursor;
  if (input->utxo != (wally_tx *)0x0) {
    push_psbt_key(cursor,max,0,(void *)0x0,0);
    iVar1 = push_length_and_tx((uchar **)max_local,psStack_20,pwStack_30->utxo,1);
    if (iVar1 != 0) {
      return iVar1;
    }
    utxo._4_4_ = 0;
  }
  if (((input_local._4_4_ & 2) == 0) || (pwStack_30->witness_utxo == (wally_tx_output *)0x0)) {
    if (pwStack_30->witness_utxo != (wally_tx_output *)0x0) {
      wit_max = (size_t)&w;
      wit_len = 0x32;
      push_psbt_key((uchar **)max_local,psStack_20,1,(void *)0x0,0);
      push_le64((uchar **)&wit_max,&wit_len,pwStack_30->witness_utxo->satoshi);
      push_varbuff((uchar **)&wit_max,&wit_len,pwStack_30->witness_utxo->script,
                   pwStack_30->witness_utxo->script_len);
      if (wit_max == 0) {
        return -2;
      }
      push_varbuff((uchar **)max_local,psStack_20,(uchar *)&w,wit_max - (long)&w);
    }
  }
  else {
    buff_len = (size_t)pwStack_30->witness_utxo;
    local_50 = push_elements_bytes_size((wally_tx_output *)buff_len);
    ptr = (uchar *)&buff_p;
    remaining = local_50;
    if ((0x400 < local_50) && (ptr = (uchar *)wally_malloc(local_50), ptr == (uchar *)0x0)) {
      return -3;
    }
    local_468 = ptr;
    push_psbt_key((uchar **)max_local,psStack_20,1,(void *)0x0,0);
    push_elements_bytes(&local_468,&local_50,*(uchar **)(buff_len + 0x20),
                        *(size_t *)(buff_len + 0x28));
    push_elements_bytes(&local_468,&local_50,*(uchar **)(buff_len + 0x30),
                        *(size_t *)(buff_len + 0x38));
    push_elements_bytes(&local_468,&local_50,*(uchar **)(buff_len + 0x40),
                        *(size_t *)(buff_len + 0x48));
    push_varbuff(&local_468,&local_50,*(uchar **)(buff_len + 8),*(size_t *)(buff_len + 0x10));
    if (local_50 == 0) {
      push_varbuff((uchar **)max_local,psStack_20,ptr,remaining);
    }
    if ((uchar **)ptr != &buff_p) {
      clear_and_free(ptr,remaining);
    }
    if (local_50 != 0) {
      return -1;
    }
  }
  push_typed_map((uchar **)max_local,psStack_20,2,&pwStack_30->signatures);
  if (pwStack_30->sighash != 0) {
    push_psbt_key((uchar **)max_local,psStack_20,3,(void *)0x0,0);
    push_varint((uchar **)max_local,psStack_20,4);
    push_le32((uchar **)max_local,psStack_20,pwStack_30->sighash);
  }
  push_typed_varbuff((uchar **)max_local,psStack_20,4,pwStack_30->redeem_script,
                     pwStack_30->redeem_script_len);
  push_typed_varbuff((uchar **)max_local,psStack_20,5,pwStack_30->witness_script,
                     pwStack_30->witness_script_len);
  push_typed_map((uchar **)max_local,psStack_20,6,&pwStack_30->keypaths);
  push_typed_varbuff((uchar **)max_local,psStack_20,7,pwStack_30->final_scriptsig,
                     pwStack_30->final_scriptsig_len);
  if (pwStack_30->final_witness != (wally_tx_witness_stack *)0x0) {
    local_4c0 = 0;
    push_psbt_key((uchar **)max_local,psStack_20,8,(void *)0x0,0);
    push_witness_stack((uchar **)0x0,&local_4c0,pwStack_30->final_witness);
    push_varint((uchar **)max_local,psStack_20,local_4c0);
    push_witness_stack((uchar **)max_local,psStack_20,pwStack_30->final_witness);
  }
  if (pwStack_30->has_value != 0) {
    push_elements_key((uchar **)max_local,psStack_20,0);
    push_varint((uchar **)max_local,psStack_20,8);
    push_le64((uchar **)max_local,psStack_20,pwStack_30->value);
  }
  push_elements_varbuff((uchar **)max_local,psStack_20,1,pwStack_30->vbf,pwStack_30->vbf_len);
  push_elements_varbuff((uchar **)max_local,psStack_20,2,pwStack_30->asset,pwStack_30->asset_len);
  push_elements_varbuff((uchar **)max_local,psStack_20,3,pwStack_30->abf,pwStack_30->abf_len);
  if (pwStack_30->pegin_tx != (wally_tx *)0x0) {
    push_elements_key((uchar **)max_local,psStack_20,4);
    iVar1 = push_length_and_tx((uchar **)max_local,psStack_20,pwStack_30->pegin_tx,1);
    if (iVar1 != 0) {
      return iVar1;
    }
    utxo._4_4_ = 0;
  }
  push_elements_varbuff
            ((uchar **)max_local,psStack_20,5,pwStack_30->txoutproof,pwStack_30->txoutproof_len);
  push_elements_varbuff
            ((uchar **)max_local,psStack_20,6,pwStack_30->genesis_blockhash,
             pwStack_30->genesis_blockhash_len);
  push_elements_varbuff
            ((uchar **)max_local,psStack_20,7,pwStack_30->claim_script,pwStack_30->claim_script_len)
  ;
  push_map((uchar **)max_local,psStack_20,&pwStack_30->unknowns);
  push_u8((uchar **)max_local,psStack_20,'\0');
  return 0;
}

Assistant:

static int push_psbt_input(unsigned char **cursor, size_t *max, uint32_t flags,
                           const struct wally_psbt_input *input)
{
    int ret;

    (void)flags;

    /* Non witness utxo */
    if (input->utxo) {
        push_psbt_key(cursor, max, PSBT_IN_NON_WITNESS_UTXO, NULL, 0);
        if ((ret = push_length_and_tx(cursor, max,
                                      input->utxo,
                                      WALLY_TX_FLAG_USE_WITNESS)) != WALLY_OK)
            return ret;
    }

    /* Witness utxo */
#ifdef BUILD_ELEMENTS
    if ((flags & WALLY_TX_FLAG_USE_ELEMENTS) && input->witness_utxo) {
        struct wally_tx_output *utxo = input->witness_utxo;
        const size_t buff_len = push_elements_bytes_size(utxo);
        size_t remaining = buff_len;
        unsigned char buff[1024], *buff_p = buff, *ptr;

        if (buff_len > sizeof(buff) && !(buff_p = wally_malloc(buff_len)))
            return WALLY_ENOMEM;
        ptr = buff_p;

        /* Push the asset, value, nonce, then scriptpubkey */
        push_psbt_key(cursor, max, PSBT_IN_WITNESS_UTXO, NULL, 0);

        push_elements_bytes(&ptr, &remaining, utxo->asset, utxo->asset_len);
        push_elements_bytes(&ptr, &remaining, utxo->value, utxo->value_len);
        push_elements_bytes(&ptr, &remaining, utxo->nonce, utxo->nonce_len);
        push_varbuff(&ptr, &remaining, utxo->script, utxo->script_len);

        if (!remaining)
            push_varbuff(cursor, max, buff_p, buff_len);
        if (buff_p != buff)
            clear_and_free(buff_p, buff_len);
        if (remaining)
            return WALLY_ERROR; /* Should not happen! */
    } else
#endif /* BUILD_ELEMENTS */
    if (input->witness_utxo) {
        unsigned char wit_bytes[50], *w = wit_bytes; /* Witness outputs can be no larger than 50 bytes as specified in BIP 141 */
        size_t wit_max = sizeof(wit_bytes);

        push_psbt_key(cursor, max, PSBT_IN_WITNESS_UTXO, NULL, 0);

        push_le64(&w, &wit_max, input->witness_utxo->satoshi);
        push_varbuff(&w, &wit_max,
                     input->witness_utxo->script,
                     input->witness_utxo->script_len);
        if (!w)
            return WALLY_EINVAL;

        push_varbuff(cursor, max, wit_bytes, w - wit_bytes);
    }
    /* Partial sigs */
    push_typed_map(cursor, max, PSBT_IN_PARTIAL_SIG, &input->signatures);
    /* Sighash type */
    if (input->sighash > 0) {
        push_psbt_key(cursor, max, PSBT_IN_SIGHASH_TYPE, NULL, 0);
        push_varint(cursor, max, sizeof(uint32_t));
        push_le32(cursor, max, input->sighash);
    }
    /* Redeem script */
    push_typed_varbuff(cursor, max, PSBT_IN_REDEEM_SCRIPT,
                       input->redeem_script, input->redeem_script_len);
    /* Witness script */
    push_typed_varbuff(cursor, max, PSBT_IN_WITNESS_SCRIPT,
                       input->witness_script, input->witness_script_len);
    /* Keypaths */
    push_typed_map(cursor, max, PSBT_IN_BIP32_DERIVATION, &input->keypaths);
    /* Final scriptSig */
    push_typed_varbuff(cursor, max, PSBT_IN_FINAL_SCRIPTSIG,
                       input->final_scriptsig, input->final_scriptsig_len);
    /* Final scriptWitness */
    if (input->final_witness) {
        size_t wit_len = 0;

        push_psbt_key(cursor, max, PSBT_IN_FINAL_SCRIPTWITNESS, NULL, 0);

        /* First pass simply calculates length */
        push_witness_stack(NULL, &wit_len, input->final_witness);

        push_varint(cursor, max, wit_len);
        push_witness_stack(cursor, max, input->final_witness);
    }
#ifdef BUILD_ELEMENTS
    /* Confidential Assets blinding data */
    if (input->has_value) {
        push_elements_key(cursor, max, PSET_IN_VALUE);
        push_varint(cursor, max, sizeof(leint64_t));
        push_le64(cursor, max, input->value);
    }
    push_elements_varbuff(cursor, max, PSET_IN_VALUE_BLINDER,
                          input->vbf, input->vbf_len);
    push_elements_varbuff(cursor, max, PSET_IN_ASSET,
                          input->asset, input->asset_len);
    push_elements_varbuff(cursor, max, PSET_IN_ASSET_BLINDER,
                          input->abf, input->abf_len);
    /* Peg ins */
    if (input->pegin_tx) {
        push_elements_key(cursor, max, PSET_IN_PEG_IN_TX);
        if ((ret = push_length_and_tx(cursor, max,
                                      input->pegin_tx,
                                      WALLY_TX_FLAG_USE_WITNESS)) != WALLY_OK)
            return ret;
    }
    push_elements_varbuff(cursor, max, PSET_IN_TXOUT_PROOF,
                          input->txoutproof, input->txoutproof_len);
    push_elements_varbuff(cursor, max, PSET_IN_GENESIS_HASH,
                          input->genesis_blockhash, input->genesis_blockhash_len);
    push_elements_varbuff(cursor, max, PSET_IN_CLAIM_SCRIPT,
                          input->claim_script, input->claim_script_len);
#endif /* BUILD_ELEMENTS */
    /* Unknowns */
    push_map(cursor, max, &input->unknowns);
    /* Separator */
    push_u8(cursor, max, PSBT_SEPARATOR);
    return WALLY_OK;
}